

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastQueue.cpp
# Opt level: O0

void __thiscall FastQueue::FastQueue(FastQueue *this,uint32_t num_buckets,uint32_t pages_per_bucket)

{
  long lVar1;
  uint8_t *puVar2;
  Bucket *this_00;
  Bucket *local_38;
  uint local_30;
  int i;
  int local_1c;
  uint32_t local_18;
  uint32_t huge_page_size;
  uint32_t pages_per_bucket_local;
  uint32_t num_buckets_local;
  FastQueue *this_local;
  
  this->num_buckets = num_buckets;
  this->pages_per_bucket = pages_per_bucket;
  this->distance = this->distance;
  local_18 = pages_per_bucket;
  huge_page_size = num_buckets;
  _pages_per_bucket_local = this;
  std::vector<Bucket_*,_std::allocator<Bucket_*>_>::vector(&this->buckets);
  lVar1 = sysconf(0x1e);
  local_1c = (int)lVar1;
  puVar2 = (uint8_t *)mmap((void *)0x0,(ulong)(local_18 * huge_page_size * local_1c),3,0x22,-1,0);
  this->base = puVar2;
  if (puVar2 == (uint8_t *)0xffffffffffffffff) {
    perror("mmap error");
    exit(0);
  }
  this->tail = 0;
  this->head = 0;
  pthread_mutex_init((pthread_mutex_t *)&this->global_mutex,(pthread_mutexattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&this->full_cond,(pthread_condattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&this->empty_cond,(pthread_condattr_t *)0x0);
  for (local_30 = 0; local_30 < huge_page_size; local_30 = local_30 + 1) {
    this_00 = (Bucket *)operator_new(0x58);
    Bucket::Bucket(this_00,this->base + local_18 * local_1c * local_30,local_18 * local_1c);
    local_38 = this_00;
    std::vector<Bucket_*,_std::allocator<Bucket_*>_>::push_back(&this->buckets,&local_38);
  }
  return;
}

Assistant:

FastQueue::FastQueue(uint32_t num_buckets, uint32_t pages_per_bucket):num_buckets(num_buckets), pages_per_bucket(pages_per_bucket), distance(distance){
    
    

    // get the page_size of current system
    uint32_t huge_page_size = sysconf(_SC_PAGESIZE);
    
    if ((base = (uint8_t*) mmap(NULL, pages_per_bucket * num_buckets * huge_page_size,
                                      PROT_WRITE | PROT_READ,
                                      MAP_PRIVATE| MAP_ANONYMOUS, -1, 0)) == MAP_FAILED) {
                perror("mmap error");
                exit(0);
    }
    

    head = tail = 0;
    pthread_mutex_init(&global_mutex, NULL);
    pthread_cond_init(&full_cond, NULL);
    pthread_cond_init(&empty_cond, NULL);

    for(int i = 0; i < num_buckets; ++i){
         buckets.push_back(new Bucket(base + i * pages_per_bucket * huge_page_size, pages_per_bucket * huge_page_size));
         //printf("%d\n", base + i * pages_per_bucket * huge_page_size);
    }
}